

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPartialUpdateTests.cpp
# Opt level: O0

void deqp::egl::anon_unknown_0::generateRandomFrame
               (Frame *dst,
               vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
               *drawTypes,Random *rnd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  const_reference pvVar6;
  undefined1 local_7c [8];
  DrawCommand drawCommand;
  Vector<int,_2> local_58;
  undefined1 local_50 [8];
  ColoredRect coloredRect;
  GLubyte b;
  GLubyte g;
  GLubyte r;
  int y2;
  int x2;
  int y1;
  int x1;
  size_t ndx;
  Random *rnd_local;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  *drawTypes_local;
  Frame *dst_local;
  
  _y1 = 0;
  while( true ) {
    sVar5 = std::
            vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
            ::size(drawTypes);
    if (sVar5 <= _y1) break;
    iVar1 = de::Random::getInt(rnd,0,(dst->width + -1) / 8);
    iVar2 = de::Random::getInt(rnd,0,(dst->height + -1) / 8);
    iVar3 = de::Random::getInt(rnd,(dst->width + -1) / 8,(dst->width + -1) / 4);
    iVar4 = de::Random::getInt(rnd,(dst->height + -1) / 8,(dst->height + -1) / 4);
    coloredRect._16_4_ = iVar4 << 2;
    coloredRect.topRight.m_data[1]._3_1_ = de::Random::getUint8(rnd);
    coloredRect.topRight.m_data[1]._2_1_ = de::Random::getUint8(rnd);
    coloredRect.topRight.m_data[1]._1_1_ = de::Random::getUint8(rnd);
    tcu::Vector<int,_2>::Vector(&local_58,iVar1 << 2,iVar2 << 2);
    tcu::Vector<int,_2>::Vector
              ((Vector<int,_2> *)&drawCommand.rect.color,iVar3 << 2,coloredRect._16_4_);
    tcu::Vector<unsigned_char,_3>::Vector
              ((Vector<unsigned_char,_3> *)((long)drawCommand.rect.topRight.m_data + 5),
               coloredRect.topRight.m_data[1]._3_1_,coloredRect.topRight.m_data[1]._2_1_,
               coloredRect.topRight.m_data[1]._1_1_);
    ColoredRect::ColoredRect
              ((ColoredRect *)local_50,&local_58,(IVec2 *)&drawCommand.rect.color,
               (Color *)((long)drawCommand.rect.topRight.m_data + 5));
    pvVar6 = std::
             vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
             ::operator[](drawTypes,_y1);
    DrawCommand::DrawCommand((DrawCommand *)local_7c,*pvVar6,(ColoredRect *)local_50);
    std::
    vector<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ::push_back(&dst->draws,(value_type *)local_7c);
    _y1 = _y1 + 1;
  }
  return;
}

Assistant:

void generateRandomFrame (Frame& dst, const vector<PartialUpdateTest::DrawType>& drawTypes, de::Random& rnd)
{
	for (size_t ndx = 0; ndx < drawTypes.size(); ndx++)
	{
		const int			x1			= rnd.getInt(0, (dst.width-1)/8) * 4;
		const int			y1			= rnd.getInt(0, (dst.height-1)/8) * 4;
		const int			x2			= rnd.getInt((dst.width-1)/8, (dst.width-1)/4) * 4;
		const int			y2			= rnd.getInt((dst.height-1)/8, (dst.height-1)/4) * 4;
		const GLubyte		r			= rnd.getUint8();
		const GLubyte		g			= rnd.getUint8();
		const GLubyte		b			= rnd.getUint8();
		const ColoredRect	coloredRect	(IVec2(x1, y1), IVec2(x2, y2), Color(r, g, b));
		const DrawCommand	drawCommand	(drawTypes[ndx], coloredRect);

		dst.draws.push_back(drawCommand);
	}
}